

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O0

LO __thiscall Omega_h::Graph::nedges(Graph *this)

{
  LOs *pLVar1;
  Graph *this_local;
  ulong local_10;
  
  pLVar1 = &this->ab2b;
  if (((ulong)(pLVar1->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((pLVar1->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(pLVar1->write_).shared_alloc_.alloc >> 3;
  }
  return (LO)(local_10 >> 2);
}

Assistant:

LO Graph::nedges() const { return ab2b.size(); }